

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Sintatico::expressao(Sintatico *this)

{
  bool bVar1;
  Sintatico *this_local;
  
  expressao_simples(this);
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,4);
  if ((((bVar1) || (bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0x1c), bVar1)) ||
      (bVar1 = Tokens::isEqual((Tokens *)this,this->tok,5), bVar1)) ||
     (((bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0x1d), bVar1 ||
       (bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0x1e), bVar1)) ||
      (bVar1 = Tokens::isEqual((Tokens *)this,this->tok,6), bVar1)))) {
    operador_relacional(this);
    expressao_simples(this);
  }
  return;
}

Assistant:

void Sintatico::expressao() {
  expressao_simples();
  if (isEqual(tok,IGUAL) ||
      isEqual(tok,DIFERENTE) ||
      isEqual(tok,MENOR) ||
      isEqual(tok,MENORIGUAL) ||
      isEqual(tok,MAIORIGUAL) ||
      isEqual(tok,MAIOR)) {
    // cout << "era pr eu ta aqui?\n";
    operador_relacional();
    expressao_simples();
  }
}